

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

void Abc_NtkDfsWithBoxes_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  uint uVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  uint uVar4;
  long lVar5;
  
  uVar4 = *(uint *)&pNode->field_0x14;
  uVar1 = uVar4 & 0xf;
  if (uVar1 == 5) {
    pNode = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray];
    uVar4 = *(uint *)&pNode->field_0x14;
    uVar1 = uVar4 & 0xf;
  }
  else if (uVar1 == 6) {
    __assert_fail("!Abc_ObjIsNet(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                  ,0x30d,"void Abc_NtkDfsWithBoxes_rec(Abc_Obj_t *, Vec_Ptr_t *)");
  }
  if (uVar1 != 2) {
    if ((uVar1 != 7) && (uVar1 != 10 && (uVar4 & 0xe) != 8)) {
      __assert_fail("Abc_ObjIsNode( pNode ) || Abc_ObjIsBox( pNode )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                    ,0x312,"void Abc_NtkDfsWithBoxes_rec(Abc_Obj_t *, Vec_Ptr_t *)");
    }
    iVar2 = Abc_NodeIsTravIdCurrent(pNode);
    if (iVar2 == 0) {
      Abc_NodeSetTravIdCurrent(pNode);
      lVar5 = 0;
      while( true ) {
        if ((pNode->vFanins).nSize <= lVar5) {
          Vec_PtrPush(vNodes,pNode);
          return;
        }
        pAVar3 = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar5]];
        if ((*(uint *)&pNode->field_0x14 & 0xe) == 8 || (*(uint *)&pNode->field_0x14 & 0xf) == 10) {
          pAVar3 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray];
        }
        if ((*(uint *)&pAVar3->field_0x14 & 0xf) != 6) break;
        pAVar3 = Abc_ObjFanin0Ntk(pAVar3);
        Abc_NtkDfsWithBoxes_rec(pAVar3,vNodes);
        lVar5 = lVar5 + 1;
      }
      __assert_fail("Abc_ObjIsNet(pFanin)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                    ,0x31a,"void Abc_NtkDfsWithBoxes_rec(Abc_Obj_t *, Vec_Ptr_t *)");
    }
  }
  return;
}

Assistant:

void Abc_NtkDfsWithBoxes_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pFanin;
    int i;
    assert( !Abc_ObjIsNet(pNode) );
    if ( Abc_ObjIsBo(pNode) )
        pNode = Abc_ObjFanin0(pNode);
    if ( Abc_ObjIsPi(pNode) )
        return;
    assert( Abc_ObjIsNode( pNode ) || Abc_ObjIsBox( pNode ) );
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return;
    Abc_NodeSetTravIdCurrent( pNode );
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        if ( Abc_ObjIsBox(pNode) )
            pFanin = Abc_ObjFanin0(pFanin);
        assert( Abc_ObjIsNet(pFanin) );
        Abc_NtkDfsWithBoxes_rec( Abc_ObjFanin0Ntk(pFanin), vNodes );
    }
    Vec_PtrPush( vNodes, pNode );
}